

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

dlep_local_neighbor *
dlep_session_add_local_neighbor(dlep_session *session,oonf_layer2_neigh_key *key)

{
  avl_node *paVar1;
  dlep_session *local_50;
  dlep_local_neighbor *local;
  oonf_layer2_neigh_key *key_local;
  dlep_session *session_local;
  
  paVar1 = avl_find(&session->local_neighbor_tree,key);
  if (paVar1 == (avl_node *)0x0) {
    local_50 = (dlep_session *)0x0;
  }
  else {
    local_50 = (dlep_session *)(paVar1 + -4);
  }
  if (local_50 == (dlep_session *)0x0) {
    if ((key->link_id_length == '\0') || ((uint)key->link_id_length == (session->cfg).lid_length)) {
      session_local = (dlep_session *)oonf_class_malloc(&_local_neighbor_class);
      if (session_local == (dlep_session *)0x0) {
        session_local = (dlep_session *)0x0;
      }
      else {
        memcpy(session_local,key,0x23);
        session_local->l2_origin = (oonf_layer2_origin *)session_local;
        avl_insert(&session->local_neighbor_tree,(avl_node *)&session_local->local_neighbor_tree);
        (session_local->parser).extensions[5] = (dlep_extension *)&_destination_ack_class;
        (session_local->parser).allowed_tlvs.comp = (_func_int_void_ptr_void_ptr *)session;
        avl_init((avl_tree *)((session_local->parser).signal_neighbor_mac._addr + 8),
                 avl_comp_netaddr,false);
      }
    }
    else {
      session_local = (dlep_session *)0x0;
    }
  }
  else {
    session_local = local_50;
  }
  return (dlep_local_neighbor *)session_local;
}

Assistant:

struct dlep_local_neighbor *
dlep_session_add_local_neighbor(struct dlep_session *session, const struct oonf_layer2_neigh_key *key) {
  struct dlep_local_neighbor *local;
  if ((local = dlep_session_get_local_neighbor(session, key))) {
    return local;
  }

  if (key->link_id_length != 0 && key->link_id_length != session->cfg.lid_length) {
    /* LIDs not allowed */
    return NULL;
  }
  local = oonf_class_malloc(&_local_neighbor_class);
  if (!local) {
    return NULL;
  }

  /* hook into tree */
  memcpy(&local->key, key, sizeof(*key));
  local->_node.key = &local->key;
  avl_insert(&session->local_neighbor_tree, &local->_node);

  /* initialize timer */
  local->_ack_timeout.class = &_destination_ack_class;

  /* initialize backpointer */
  local->session = session;

  avl_init(&local->_ip_prefix_modification, avl_comp_netaddr, false);

  return local;
}